

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_8x16_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [16];
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  ushort uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  ushort uVar81;
  ushort uVar82;
  int iVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  long lVar97;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  int i_3;
  int i_2;
  __m256i d [8];
  __m256i dstvec [8];
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int mdif;
  __m256i shift_1;
  int i_1;
  int base_1;
  __m256i res1;
  __m256i res_1 [2];
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a1_2;
  __m256i a0_1;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  int local_1328;
  int local_1324;
  undefined8 local_1320 [13];
  __m256i *in_stack_ffffffffffffed48;
  __m256i *in_stack_ffffffffffffed50;
  undefined8 local_1220 [38];
  long local_10f0;
  long local_10e8;
  undefined1 local_1080 [32];
  int local_1048;
  int local_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  int local_fe8;
  uint local_fe4;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined4 local_e88;
  undefined4 local_e84;
  undefined8 *local_e70;
  undefined4 local_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ushort local_dda;
  undefined2 local_dd8;
  undefined2 local_dd6;
  ushort local_dd4;
  undefined2 local_dd2;
  undefined1 (*local_dd0) [32];
  undefined1 (*local_dc8) [32];
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  undefined2 local_da0;
  undefined2 local_d9e;
  undefined2 local_d9c;
  undefined2 local_d9a;
  undefined2 local_d98;
  undefined2 local_d96;
  undefined2 local_d94;
  undefined2 local_d92;
  undefined2 local_d90;
  undefined2 local_d8e;
  undefined2 local_d8c;
  undefined2 local_d8a;
  undefined2 local_d88;
  undefined2 local_d86;
  undefined2 local_d84;
  undefined2 local_d82;
  undefined1 local_d80 [16];
  undefined1 auStack_d70 [16];
  ushort local_d60;
  ushort local_d5e;
  ushort local_d5c;
  ushort local_d5a;
  ushort local_d58;
  ushort local_d56;
  ushort local_d54;
  ushort local_d52;
  ushort local_d50;
  ushort local_d4e;
  ushort local_d4c;
  ushort local_d4a;
  ushort local_d48;
  ushort local_d46;
  ushort local_d44;
  ushort local_d42;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  undefined2 local_d20;
  undefined2 local_d1e;
  undefined2 local_d1c;
  undefined2 local_d1a;
  undefined2 local_d18;
  undefined2 local_d16;
  undefined2 local_d14;
  undefined2 local_d12;
  undefined2 local_d10;
  undefined2 local_d0e;
  undefined2 local_d0c;
  undefined2 local_d0a;
  undefined2 local_d08;
  undefined2 local_d06;
  undefined2 local_d04;
  undefined2 local_d02;
  undefined1 local_d00 [32];
  undefined2 local_ce0;
  undefined2 local_cde;
  undefined2 local_cdc;
  undefined2 local_cda;
  undefined2 local_cd8;
  undefined2 local_cd6;
  undefined2 local_cd4;
  undefined2 local_cd2;
  undefined2 local_cd0;
  undefined2 local_cce;
  undefined2 local_ccc;
  undefined2 local_cca;
  undefined2 local_cc8;
  undefined2 local_cc6;
  undefined2 local_cc4;
  undefined2 local_cc2;
  undefined1 local_cc0 [16];
  undefined1 auStack_cb0 [16];
  ushort local_ca0;
  ushort local_c9e;
  ushort local_c9c;
  ushort local_c9a;
  ushort local_c98;
  ushort local_c96;
  ushort local_c94;
  ushort local_c92;
  ushort local_c90;
  ushort local_c8e;
  ushort local_c8c;
  ushort local_c8a;
  ushort local_c88;
  ushort local_c86;
  ushort local_c84;
  ushort local_c82;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [16];
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined4 local_b64;
  undefined1 local_b60 [32];
  undefined4 local_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  ushort local_ac0;
  ushort local_abe;
  ushort local_abc;
  ushort local_aba;
  ushort local_ab8;
  ushort local_ab6;
  ushort local_ab4;
  ushort local_ab2;
  ushort local_ab0;
  ushort local_aae;
  ushort local_aac;
  ushort local_aaa;
  ushort local_aa8;
  ushort local_aa6;
  ushort local_aa4;
  ushort local_aa2;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  ushort local_a80;
  ushort local_a7e;
  ushort local_a7c;
  ushort local_a7a;
  ushort local_a78;
  ushort local_a76;
  ushort local_a74;
  ushort local_a72;
  ushort local_a70;
  ushort local_a6e;
  ushort local_a6c;
  ushort local_a6a;
  ushort local_a68;
  ushort local_a66;
  ushort local_a64;
  ushort local_a62;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_9e4;
  undefined1 local_9e0 [32];
  int local_9a8;
  int local_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  int local_908;
  uint local_904;
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_788;
  undefined4 local_784;
  undefined8 *local_770;
  undefined4 local_768;
  undefined2 local_764;
  ushort local_762;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  ushort local_700;
  ushort local_6fe;
  ushort local_6fc;
  ushort local_6fa;
  ushort local_6f8;
  ushort local_6f6;
  ushort local_6f4;
  ushort local_6f2;
  ushort local_6f0;
  ushort local_6ee;
  ushort local_6ec;
  ushort local_6ea;
  ushort local_6e8;
  ushort local_6e6;
  ushort local_6e4;
  ushort local_6e2;
  undefined1 local_6e0 [32];
  undefined2 local_6c0;
  undefined2 local_6be;
  undefined2 local_6bc;
  undefined2 local_6ba;
  undefined2 local_6b8;
  undefined2 local_6b6;
  undefined2 local_6b4;
  undefined2 local_6b2;
  undefined2 local_6b0;
  undefined2 local_6ae;
  undefined2 local_6ac;
  undefined2 local_6aa;
  undefined2 local_6a8;
  undefined2 local_6a6;
  undefined2 local_6a4;
  undefined2 local_6a2;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 (*local_610) [16];
  undefined1 (*local_608) [16];
  undefined1 (*local_600) [16];
  undefined1 (*local_5f8) [16];
  undefined4 local_5ec;
  uint local_5e8;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  uint local_540;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  uint local_524;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined4 local_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined4 local_444;
  undefined1 local_440 [32];
  undefined4 local_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  ushort local_1a0;
  ushort local_19e;
  ushort local_19c;
  ushort local_19a;
  ushort local_198;
  ushort local_196;
  ushort local_194;
  ushort local_192;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  ushort local_188;
  ushort local_186;
  ushort local_184;
  ushort local_182;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar10._8_8_ = local_680._8_8_;
  auVar10._0_8_ = local_680._0_8_;
  auVar17._8_8_ = local_c00._8_8_;
  auVar17._0_8_ = local_c00._0_8_;
  auVar100._8_8_ = local_120._8_8_;
  auVar100._0_8_ = local_120._0_8_;
  auVar99._24_8_ = auStack_8b0._8_8_;
  auVar99._16_8_ = auStack_8b0._0_8_;
  auVar99._8_8_ = local_8c0._8_8_;
  auVar99._0_8_ = local_8c0._0_8_;
  auVar98._24_8_ = auStack_f30._8_8_;
  auVar98._16_8_ = auStack_f30._0_8_;
  auVar98._8_8_ = local_f40._8_8_;
  auVar98._0_8_ = local_f40._0_8_;
  if (in_R9D < 0xc) {
    local_e64 = 8;
    local_e84 = 6;
    local_dd2 = 0x10;
    local_d82 = 0x10;
    local_d84 = 0x10;
    local_d86 = 0x10;
    local_d88 = 0x10;
    local_d8a = 0x10;
    local_d8c = 0x10;
    local_d8e = 0x10;
    local_d90 = 0x10;
    local_d92 = 0x10;
    local_d94 = 0x10;
    local_d96 = 0x10;
    local_d98 = 0x10;
    local_d9a = 0x10;
    local_d9c = 0x10;
    local_d9e = 0x10;
    local_da0 = 0x10;
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,6);
    auVar11 = vpinsrw_avx(auVar98._0_16_,0x10,7);
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x10,6);
    auVar12 = vpinsrw_avx(auVar98._0_16_,0x10,7);
    local_dc0._0_8_ = auVar11._0_8_;
    local_dc0._8_8_ = auVar11._8_8_;
    auStack_db0._0_8_ = auVar12._0_8_;
    auStack_db0._8_8_ = auVar12._8_8_;
    local_f20 = local_dc0._0_8_;
    uStack_f18 = local_dc0._8_8_;
    uStack_f10 = auStack_db0._0_8_;
    uStack_f08 = auStack_db0._8_8_;
    uVar6 = *(ushort *)(in_RDX + 0x2e);
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(uVar6),(uint)uVar6,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,6);
    auVar13 = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,7);
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(uVar6),(uint)uVar6,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,6);
    auVar14 = vpinsrw_avx(auVar98._0_16_,(uint)uVar6,7);
    local_d80._0_8_ = auVar13._0_8_;
    local_d80._8_8_ = auVar13._8_8_;
    auStack_d70._0_8_ = auVar14._0_8_;
    auStack_d70._8_8_ = auVar14._8_8_;
    local_f60 = local_d80._0_8_;
    uStack_f58 = local_d80._8_8_;
    uStack_f50 = auStack_d70._0_8_;
    uStack_f48 = auStack_d70._8_8_;
    local_dd6 = 0x17;
    local_d02 = 0x17;
    local_d04 = 0x17;
    local_d06 = 0x17;
    local_d08 = 0x17;
    local_d0a = 0x17;
    local_d0c = 0x17;
    local_d0e = 0x17;
    local_d10 = 0x17;
    local_d12 = 0x17;
    local_d14 = 0x17;
    local_d16 = 0x17;
    local_d18 = 0x17;
    local_d1a = 0x17;
    local_d1c = 0x17;
    local_d1e = 0x17;
    local_d20 = 0x17;
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x17),0x17,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,6);
    auVar15 = vpinsrw_avx(auVar98._0_16_,0x17,7);
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x17),0x17,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x17,6);
    auVar16 = vpinsrw_avx(auVar98._0_16_,0x17,7);
    local_d40._0_8_ = auVar15._0_8_;
    local_d40._8_8_ = auVar15._8_8_;
    auStack_d30._0_8_ = auVar16._0_8_;
    auStack_d30._8_8_ = auVar16._8_8_;
    local_fa0 = local_d40._0_8_;
    uStack_f98 = local_d40._8_8_;
    uStack_f90 = auStack_d30._0_8_;
    uStack_f88 = auStack_d30._8_8_;
    local_dd8 = 0x3f;
    local_cc2 = 0x3f;
    local_cc4 = 0x3f;
    local_cc6 = 0x3f;
    local_cc8 = 0x3f;
    local_cca = 0x3f;
    local_ccc = 0x3f;
    local_cce = 0x3f;
    local_cd0 = 0x3f;
    local_cd2 = 0x3f;
    local_cd4 = 0x3f;
    local_cd6 = 0x3f;
    local_cd8 = 0x3f;
    local_cda = 0x3f;
    local_cdc = 0x3f;
    local_cde = 0x3f;
    local_ce0 = 0x3f;
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,6);
    auVar98._16_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,7);
    auVar98._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,2);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,3);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,4);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,5);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,6);
    auVar98._0_16_ = vpinsrw_avx(auVar98._0_16_,0x3f,7);
    auVar98._0_16_ = ZEXT116(0) * auVar98._16_16_ + ZEXT116(1) * auVar98._0_16_;
    auVar98._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar98._16_16_;
    local_d00._16_8_ = auVar98._16_8_;
    local_d00._24_8_ = auVar98._24_8_;
    local_fe4 = in_R8D;
    for (local_fe8 = 0; local_e88 = 0x17, local_e70 = local_1220, local_dd4 = uVar6,
        local_d60 = uVar6, local_d5e = uVar6, local_d5c = uVar6, local_d5a = uVar6,
        local_d58 = uVar6, local_d56 = uVar6, local_d54 = uVar6, local_d52 = uVar6,
        local_d50 = uVar6, local_d4e = uVar6, local_d4c = uVar6, local_d4a = uVar6,
        local_d48 = uVar6, local_d46 = uVar6, local_d44 = uVar6, local_d42 = uVar6,
        auVar26 = auVar98, auVar20 = local_720, auVar21 = auStack_710, auVar22 = local_6e0,
        auVar18 = local_5a0, auVar19 = auStack_590, local_fe8 < 8; local_fe8 = local_fe8 + 1) {
      iVar83 = (int)local_fe4 >> 6;
      local_1044 = iVar83;
      if (0x16 < iVar83) {
        for (local_1048 = local_fe8; local_1048 < 8; local_1048 = local_1048 + 1) {
          lVar97 = (long)local_1048;
          local_1220[lVar97 * 4] = local_d80._0_8_;
          local_1220[lVar97 * 4 + 1] = local_d80._8_8_;
          local_1220[lVar97 * 4 + 2] = auStack_d70._0_8_;
          local_1220[lVar97 * 4 + 3] = auStack_d70._8_8_;
        }
        break;
      }
      uVar7 = (ushort)local_fe4;
      auVar17 = vpinsrw_avx(ZEXT216((ushort)local_fe4),local_fe4 & 0xffff,1);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,2);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,3);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,4);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,5);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,6);
      auVar17 = vpinsrw_avx(auVar17,local_fe4 & 0xffff,7);
      auVar18 = vpinsrw_avx(ZEXT216((ushort)local_fe4),local_fe4 & 0xffff,1);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,2);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,3);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,4);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,5);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,6);
      auVar18 = vpinsrw_avx(auVar18,local_fe4 & 0xffff,7);
      local_cc0._0_8_ = auVar17._0_8_;
      uVar31 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar17._8_8_;
      uVar32 = local_cc0._8_8_;
      auStack_cb0._0_8_ = auVar18._0_8_;
      uVar33 = auStack_cb0._0_8_;
      auStack_cb0._8_8_ = auVar18._8_8_;
      uVar34 = auStack_cb0._8_8_;
      auVar25._16_8_ = auStack_cb0._0_8_;
      auVar25._0_16_ = auVar17;
      auVar25._24_8_ = auStack_cb0._8_8_;
      auVar23._16_8_ = local_d00._16_8_;
      auVar23._0_16_ = auVar98._0_16_;
      auVar23._24_8_ = local_d00._24_8_;
      auVar23 = vpand_avx2(auVar25,auVar23);
      local_b64 = 1;
      auVar27 = vpsrlw_avx2(auVar23,ZEXT416(1));
      pauVar1 = (undefined1 (*) [32])(in_RDX + (long)iVar83 * 2);
      uVar35 = *(undefined8 *)*pauVar1;
      uVar36 = *(undefined8 *)(*pauVar1 + 8);
      uVar37 = *(undefined8 *)(*pauVar1 + 0x10);
      uVar38 = *(undefined8 *)(*pauVar1 + 0x18);
      pauVar4 = (undefined1 (*) [32])(in_RDX + 2 + (long)iVar83 * 2);
      uVar39 = *(undefined8 *)*pauVar4;
      uVar40 = *(undefined8 *)(*pauVar4 + 8);
      uVar41 = *(undefined8 *)(*pauVar4 + 0x10);
      uVar42 = *(undefined8 *)(*pauVar4 + 0x18);
      auVar29 = vpsubw_avx2(*pauVar4,*pauVar1);
      local_b24 = 5;
      auVar26 = vpsllw_avx2(*pauVar1,ZEXT416(5));
      local_f00._0_8_ = auVar26._0_8_;
      uVar43 = local_f00._0_8_;
      local_f00._8_8_ = auVar26._8_8_;
      uVar44 = local_f00._8_8_;
      local_f00._16_8_ = auVar26._16_8_;
      uVar45 = local_f00._16_8_;
      local_f00._24_8_ = auVar26._24_8_;
      uVar46 = local_f00._24_8_;
      auVar24._16_8_ = auStack_db0._0_8_;
      auVar24._0_16_ = auVar11;
      auVar24._24_8_ = auStack_db0._8_8_;
      auVar26 = vpaddw_avx2(auVar26,auVar24);
      local_f80._0_8_ = auVar29._0_8_;
      uVar47 = local_f80._0_8_;
      local_f80._8_8_ = auVar29._8_8_;
      uVar48 = local_f80._8_8_;
      local_f80._16_8_ = auVar29._16_8_;
      uVar49 = local_f80._16_8_;
      local_f80._24_8_ = auVar29._24_8_;
      uVar50 = local_f80._24_8_;
      local_1080._0_8_ = auVar27._0_8_;
      uVar51 = local_1080._0_8_;
      local_1080._8_8_ = auVar27._8_8_;
      uVar52 = local_1080._8_8_;
      local_1080._16_8_ = auVar27._16_8_;
      uVar53 = local_1080._16_8_;
      local_1080._24_8_ = auVar27._24_8_;
      uVar54 = local_1080._24_8_;
      auVar25 = vpmullw_avx2(auVar29,auVar27);
      local_f00._0_8_ = auVar26._0_8_;
      uVar55 = local_f00._0_8_;
      local_f00._8_8_ = auVar26._8_8_;
      uVar56 = local_f00._8_8_;
      local_f00._16_8_ = auVar26._16_8_;
      uVar57 = local_f00._16_8_;
      local_f00._24_8_ = auVar26._24_8_;
      uVar58 = local_f00._24_8_;
      local_1020._0_8_ = auVar25._0_8_;
      uVar59 = local_1020._0_8_;
      local_1020._8_8_ = auVar25._8_8_;
      uVar60 = local_1020._8_8_;
      local_1020._16_8_ = auVar25._16_8_;
      uVar61 = local_1020._16_8_;
      local_1020._24_8_ = auVar25._24_8_;
      uVar62 = local_1020._24_8_;
      auVar22 = vpaddw_avx2(auVar26,auVar25);
      local_1040._0_8_ = auVar22._0_8_;
      uVar63 = local_1040._0_8_;
      local_1040._8_8_ = auVar22._8_8_;
      uVar64 = local_1040._8_8_;
      local_1040._16_8_ = auVar22._16_8_;
      uVar65 = local_1040._16_8_;
      local_1040._24_8_ = auVar22._24_8_;
      uVar66 = local_1040._24_8_;
      local_ba4 = 5;
      auVar28 = vpsrlw_avx2(auVar22,ZEXT416(5));
      uVar81 = (ushort)iVar83;
      uVar84 = uVar81 + 1;
      uVar85 = uVar81 + 2;
      uVar86 = uVar81 + 3;
      uVar87 = uVar81 + 4;
      uVar88 = uVar81 + 5;
      uVar89 = uVar81 + 6;
      uVar90 = uVar81 + 7;
      uVar91 = uVar81 + 8;
      uVar30 = uVar81 + 9;
      uVar92 = uVar81 + 10;
      uVar93 = uVar81 + 0xb;
      uVar94 = uVar81 + 0xc;
      uVar95 = uVar81 + 0xd;
      uVar96 = uVar81 + 0xe;
      uVar82 = uVar81 + 0xf;
      auVar19 = vpinsrw_avx(ZEXT216(uVar81),(uint)uVar84,1);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar85,2);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar86,3);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar87,4);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar88,5);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar89,6);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar90,7);
      auVar20 = vpinsrw_avx(ZEXT216(uVar91),(uint)uVar30,1);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar92,2);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar93,3);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar94,4);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar95,5);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar96,6);
      auVar20 = vpinsrw_avx(auVar20,(uint)uVar82,7);
      local_aa0._0_8_ = auVar19._0_8_;
      local_aa0._8_8_ = auVar19._8_8_;
      auStack_a90._0_8_ = auVar20._0_8_;
      auStack_a90._8_8_ = auVar20._8_8_;
      auVar76._16_8_ = auStack_d30._0_8_;
      auVar76._0_16_ = auVar15;
      auVar76._24_8_ = auStack_d30._8_8_;
      auVar75._16_8_ = auStack_a90._0_8_;
      auVar75._0_16_ = auVar19;
      auVar75._24_8_ = auStack_a90._8_8_;
      auVar24 = vpcmpgtw_avx2(auVar76,auVar75);
      local_1040._0_8_ = auVar28._0_8_;
      uVar67 = local_1040._0_8_;
      local_1040._8_8_ = auVar28._8_8_;
      uVar68 = local_1040._8_8_;
      local_1040._16_8_ = auVar28._16_8_;
      uVar69 = local_1040._16_8_;
      local_1040._24_8_ = auVar28._24_8_;
      uVar70 = local_1040._24_8_;
      local_fe0._0_8_ = auVar24._0_8_;
      uVar71 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar24._8_8_;
      uVar72 = local_fe0._8_8_;
      local_fe0._16_8_ = auVar24._16_8_;
      uVar73 = local_fe0._16_8_;
      local_fe0._24_8_ = auVar24._24_8_;
      uVar74 = local_fe0._24_8_;
      auVar77._16_8_ = auStack_d70._0_8_;
      auVar77._0_16_ = auVar13;
      auVar77._24_8_ = auStack_d70._8_8_;
      auVar22 = vpblendvb_avx2(auVar77,auVar28,auVar24);
      *(undefined1 (*) [32])(local_1220 + (long)local_fe8 * 4) = auVar22;
      local_fe4 = in_R8D + local_fe4;
      local_1080 = auVar27;
      local_1040 = auVar28;
      local_1020 = auVar25;
      local_fe0 = auVar24;
      local_fc0 = local_aa0._0_8_;
      uStack_fb8 = local_aa0._8_8_;
      uStack_fb0 = auStack_a90._0_8_;
      uStack_fa8 = auStack_a90._8_8_;
      local_f80 = auVar29;
      local_f00 = auVar26;
      local_ee0 = uVar39;
      uStack_ed8 = uVar40;
      uStack_ed0 = uVar41;
      uStack_ec8 = uVar42;
      local_ec0 = uVar35;
      uStack_eb8 = uVar36;
      uStack_eb0 = uVar37;
      uStack_ea8 = uVar38;
      local_e60 = uVar59;
      uStack_e58 = uVar60;
      uStack_e50 = uVar61;
      uStack_e48 = uVar62;
      local_e40 = uVar55;
      uStack_e38 = uVar56;
      uStack_e30 = uVar57;
      uStack_e28 = uVar58;
      local_e20 = local_dc0._0_8_;
      uStack_e18 = local_dc0._8_8_;
      uStack_e10 = auStack_db0._0_8_;
      uStack_e08 = auStack_db0._8_8_;
      local_e00 = uVar43;
      uStack_df8 = uVar44;
      uStack_df0 = uVar45;
      uStack_de8 = uVar46;
      local_dda = uVar7;
      local_dd0 = pauVar4;
      local_dc8 = pauVar1;
      local_cc0 = auVar17;
      auStack_cb0 = auVar18;
      local_ca0 = uVar7;
      local_c9e = uVar7;
      local_c9c = uVar7;
      local_c9a = uVar7;
      local_c98 = uVar7;
      local_c96 = uVar7;
      local_c94 = uVar7;
      local_c92 = uVar7;
      local_c90 = uVar7;
      local_c8e = uVar7;
      local_c8c = uVar7;
      local_c8a = uVar7;
      local_c88 = uVar7;
      local_c86 = uVar7;
      local_c84 = uVar7;
      local_c82 = uVar7;
      local_c80 = uVar35;
      uStack_c78 = uVar36;
      uStack_c70 = uVar37;
      uStack_c68 = uVar38;
      local_c60 = uVar39;
      uStack_c58 = uVar40;
      uStack_c50 = uVar41;
      uStack_c48 = uVar42;
      local_c40 = local_aa0._0_8_;
      uStack_c38 = local_aa0._8_8_;
      uStack_c30 = auStack_a90._0_8_;
      uStack_c28 = auStack_a90._8_8_;
      local_c20 = local_d40._0_8_;
      uStack_c18 = local_d40._8_8_;
      uStack_c10 = auStack_d30._0_8_;
      uStack_c08 = auStack_d30._8_8_;
      uStack_bf0 = local_d00._16_8_;
      uStack_be8 = local_d00._24_8_;
      local_be0 = uVar31;
      uStack_bd8 = uVar32;
      uStack_bd0 = uVar33;
      uStack_bc8 = uVar34;
      local_ba0 = uVar63;
      uStack_b98 = uVar64;
      uStack_b90 = uVar65;
      uStack_b88 = uVar66;
      local_b60 = auVar23;
      local_b20 = uVar35;
      uStack_b18 = uVar36;
      uStack_b10 = uVar37;
      uStack_b08 = uVar38;
      local_b00 = uVar51;
      uStack_af8 = uVar52;
      uStack_af0 = uVar53;
      uStack_ae8 = uVar54;
      local_ae0 = uVar47;
      uStack_ad8 = uVar48;
      uStack_ad0 = uVar49;
      uStack_ac8 = uVar50;
      local_ac0 = uVar82;
      local_abe = uVar96;
      local_abc = uVar95;
      local_aba = uVar94;
      local_ab8 = uVar93;
      local_ab6 = uVar92;
      local_ab4 = uVar30;
      local_ab2 = uVar91;
      local_ab0 = uVar90;
      local_aae = uVar89;
      local_aac = uVar88;
      local_aaa = uVar87;
      local_aa8 = uVar86;
      local_aa6 = uVar85;
      local_aa4 = uVar84;
      local_aa2 = uVar81;
      local_aa0 = auVar19;
      auStack_a90 = auVar20;
      local_a80 = uVar81;
      local_a7e = uVar84;
      local_a7c = uVar85;
      local_a7a = uVar86;
      local_a78 = uVar87;
      local_a76 = uVar88;
      local_a74 = uVar89;
      local_a72 = uVar90;
      local_a70 = uVar91;
      local_a6e = uVar30;
      local_a6c = uVar92;
      local_a6a = uVar93;
      local_a68 = uVar94;
      local_a66 = uVar95;
      local_a64 = uVar96;
      local_a62 = uVar82;
      local_a60 = uVar71;
      uStack_a58 = uVar72;
      uStack_a50 = uVar73;
      uStack_a48 = uVar74;
      local_a40 = uVar67;
      uStack_a38 = uVar68;
      uStack_a30 = uVar69;
      uStack_a28 = uVar70;
      local_a20 = local_d80._0_8_;
      uStack_a18 = local_d80._8_8_;
      uStack_a10 = auStack_d70._0_8_;
      uStack_a08 = auStack_d70._8_8_;
      auVar17 = auVar98._0_16_;
    }
  }
  else {
    local_768 = 8;
    local_784 = 6;
    local_5e4 = 0x10;
    local_564 = 0x10;
    local_568 = 0x10;
    local_56c = 0x10;
    local_570 = 0x10;
    local_574 = 0x10;
    local_578 = 0x10;
    local_57c = 0x10;
    local_580 = 0x10;
    auVar99._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar99._0_16_ = vpinsrd_avx(auVar99._0_16_,0x10,2);
    auVar18 = vpinsrd_avx(auVar99._0_16_,0x10,3);
    auVar99._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar99._0_16_ = vpinsrd_avx(auVar99._0_16_,0x10,2);
    auVar19 = vpinsrd_avx(auVar99._0_16_,0x10,3);
    local_5a0._0_8_ = auVar18._0_8_;
    local_5a0._8_8_ = auVar18._8_8_;
    auStack_590._0_8_ = auVar19._0_8_;
    auStack_590._8_8_ = auVar19._8_8_;
    local_860 = local_5a0._0_8_;
    uStack_858 = local_5a0._8_8_;
    uStack_850 = auStack_590._0_8_;
    uStack_848 = auStack_590._8_8_;
    uVar6 = *(ushort *)(in_RDX + 0x2e);
    auVar99._0_16_ = vpinsrw_avx(ZEXT216(uVar6),(uint)uVar6,1);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,2);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,3);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,4);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,5);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,6);
    auVar20 = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,7);
    auVar99._0_16_ = vpinsrw_avx(ZEXT216(uVar6),(uint)uVar6,1);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,2);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,3);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,4);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,5);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,6);
    auVar21 = vpinsrw_avx(auVar99._0_16_,(uint)uVar6,7);
    local_720._0_8_ = auVar20._0_8_;
    local_720._8_8_ = auVar20._8_8_;
    auStack_710._0_8_ = auVar21._0_8_;
    auStack_710._8_8_ = auVar21._8_8_;
    local_880 = local_720._0_8_;
    uStack_878 = local_720._8_8_;
    uStack_870 = auStack_710._0_8_;
    uStack_868 = auStack_710._8_8_;
    local_764 = 0x17;
    local_6a2 = 0x17;
    local_6a4 = 0x17;
    local_6a6 = 0x17;
    local_6a8 = 0x17;
    local_6aa = 0x17;
    local_6ac = 0x17;
    local_6ae = 0x17;
    local_6b0 = 0x17;
    local_6b2 = 0x17;
    local_6b4 = 0x17;
    local_6b6 = 0x17;
    local_6b8 = 0x17;
    local_6ba = 0x17;
    local_6bc = 0x17;
    local_6be = 0x17;
    local_6c0 = 0x17;
    auVar99._0_16_ = vpinsrw_avx(ZEXT216(0x17),0x17,1);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,2);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,3);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,4);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,5);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,6);
    auVar99._16_16_ = vpinsrw_avx(auVar99._0_16_,0x17,7);
    auVar99._0_16_ = vpinsrw_avx(ZEXT216(0x17),0x17,1);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,2);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,3);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,4);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,5);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,6);
    auVar99._0_16_ = vpinsrw_avx(auVar99._0_16_,0x17,7);
    auVar99._0_16_ = ZEXT116(0) * auVar99._16_16_ + ZEXT116(1) * auVar99._0_16_;
    auVar99._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99._16_16_;
    local_6e0._16_8_ = auVar99._16_8_;
    local_6e0._24_8_ = auVar99._24_8_;
    local_904 = in_R8D;
    for (local_908 = 0; auVar11 = local_dc0, auVar12 = auStack_db0, auVar13 = local_d80,
        auVar14 = auStack_d70, auVar15 = local_d40, auVar16 = auStack_d30, auVar26 = local_d00,
        local_788 = 0x17, local_770 = local_1220, local_762 = uVar6, local_700 = uVar6,
        local_6fe = uVar6, local_6fc = uVar6, local_6fa = uVar6, local_6f8 = uVar6,
        local_6f6 = uVar6, local_6f4 = uVar6, local_6f2 = uVar6, local_6f0 = uVar6,
        local_6ee = uVar6, local_6ec = uVar6, local_6ea = uVar6, local_6e8 = uVar6,
        local_6e6 = uVar6, local_6e4 = uVar6, local_6e2 = uVar6, auVar22 = auVar99, local_908 < 8;
        local_908 = local_908 + 1) {
      iVar83 = (int)local_904 >> 6;
      local_9a4 = iVar83;
      if (0x16 < iVar83) {
        for (local_9a8 = local_908; local_9a8 < 8; local_9a8 = local_9a8 + 1) {
          lVar97 = (long)local_9a8;
          local_1220[lVar97 * 4] = local_720._0_8_;
          local_1220[lVar97 * 4 + 1] = local_720._8_8_;
          local_1220[lVar97 * 4 + 2] = auStack_710._0_8_;
          local_1220[lVar97 * 4 + 3] = auStack_710._8_8_;
        }
        break;
      }
      uVar8 = local_904;
      auVar100._0_16_ = vpinsrd_avx(ZEXT416(local_904),local_904,1);
      auVar100._0_16_ = vpinsrd_avx(auVar100._0_16_,local_904,2);
      auVar10 = vpinsrd_avx(auVar100._0_16_,local_904,3);
      auVar100._0_16_ = vpinsrd_avx(ZEXT416(local_904),local_904,1);
      auVar100._0_16_ = vpinsrd_avx(auVar100._0_16_,local_904,2);
      auVar11 = vpinsrd_avx(auVar100._0_16_,local_904,3);
      local_560._0_8_ = auVar10._0_8_;
      local_560._8_8_ = auVar10._8_8_;
      auStack_550._0_8_ = auVar11._0_8_;
      auStack_550._8_8_ = auVar11._8_8_;
      local_5ec = 0x3f;
      uVar9 = 0x3f;
      auVar100._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
      auVar100._0_16_ = vpinsrd_avx(auVar100._0_16_,0x3f,2);
      auVar12 = vpinsrd_avx(auVar100._0_16_,0x3f,3);
      auVar100._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
      auVar100._0_16_ = vpinsrd_avx(auVar100._0_16_,0x3f,2);
      auVar13 = vpinsrd_avx(auVar100._0_16_,0x3f,3);
      local_520._0_8_ = auVar12._0_8_;
      local_520._8_8_ = auVar12._8_8_;
      auStack_510._0_8_ = auVar13._0_8_;
      auStack_510._8_8_ = auVar13._8_8_;
      auVar22._16_8_ = auStack_550._0_8_;
      auVar22._0_16_ = auVar10;
      auVar22._24_8_ = auStack_550._8_8_;
      auVar26._16_8_ = auStack_510._0_8_;
      auVar26._0_16_ = auVar12;
      auVar26._24_8_ = auStack_510._8_8_;
      auVar22 = vpand_avx2(auVar22,auVar26);
      local_444 = 1;
      auVar25 = vpsrld_avx2(auVar22,ZEXT416(1));
      pauVar2 = (undefined1 (*) [16])(in_RDX + (long)iVar83 * 2);
      uVar31 = *(undefined8 *)*pauVar2;
      uVar32 = *(undefined8 *)(*pauVar2 + 8);
      auVar23 = vpmovzxwd_avx2(*pauVar2);
      pauVar5 = (undefined1 (*) [16])(in_RDX + 2 + (long)iVar83 * 2);
      uVar33 = *(undefined8 *)*pauVar5;
      uVar34 = *(undefined8 *)(*pauVar5 + 8);
      auVar24 = vpmovzxwd_avx2(*pauVar5);
      local_800._0_8_ = auVar24._0_8_;
      uVar37 = local_800._0_8_;
      local_800._8_8_ = auVar24._8_8_;
      uVar38 = local_800._8_8_;
      local_800._16_8_ = auVar24._16_8_;
      uVar39 = local_800._16_8_;
      local_800._24_8_ = auVar24._24_8_;
      uVar40 = local_800._24_8_;
      local_7c0._0_8_ = auVar23._0_8_;
      uVar41 = local_7c0._0_8_;
      local_7c0._8_8_ = auVar23._8_8_;
      uVar42 = local_7c0._8_8_;
      local_7c0._16_8_ = auVar23._16_8_;
      uVar43 = local_7c0._16_8_;
      local_7c0._24_8_ = auVar23._24_8_;
      uVar44 = local_7c0._24_8_;
      local_8a0 = vpsubd_avx2(auVar24,auVar23);
      local_3c4 = 5;
      auVar100 = vpslld_avx2(auVar23,ZEXT416(5));
      local_840._0_8_ = auVar100._0_8_;
      uVar45 = local_840._0_8_;
      local_840._8_8_ = auVar100._8_8_;
      uVar46 = local_840._8_8_;
      local_840._16_8_ = auVar100._16_8_;
      uVar47 = local_840._16_8_;
      local_840._24_8_ = auVar100._24_8_;
      uVar48 = local_840._24_8_;
      auVar27._16_8_ = auStack_590._0_8_;
      auVar27._0_16_ = auVar18;
      auVar27._24_8_ = auStack_590._8_8_;
      local_840 = vpaddd_avx2(auVar100,auVar27);
      local_1c0 = local_8a0._0_8_;
      uStack_1b8 = local_8a0._8_8_;
      uStack_1b0 = local_8a0._16_8_;
      uStack_1a8 = local_8a0._24_8_;
      local_9e0._0_8_ = auVar25._0_8_;
      local_1e0 = local_9e0._0_8_;
      local_9e0._8_8_ = auVar25._8_8_;
      uStack_1d8 = local_9e0._8_8_;
      local_9e0._16_8_ = auVar25._16_8_;
      uStack_1d0 = local_9e0._16_8_;
      local_9e0._24_8_ = auVar25._24_8_;
      uStack_1c8 = local_9e0._24_8_;
      local_940 = vpmulld_avx2(local_8a0,auVar25);
      uVar49 = local_840._0_8_;
      uVar50 = local_840._8_8_;
      uVar51 = local_840._16_8_;
      uVar52 = local_840._24_8_;
      uVar53 = local_940._0_8_;
      uVar54 = local_940._8_8_;
      uVar55 = local_940._16_8_;
      uVar56 = local_940._24_8_;
      auVar100 = vpaddd_avx2(local_840,local_940);
      local_980._0_8_ = auVar100._0_8_;
      uVar57 = local_980._0_8_;
      local_980._8_8_ = auVar100._8_8_;
      uVar58 = local_980._8_8_;
      local_980._16_8_ = auVar100._16_8_;
      uVar59 = local_980._16_8_;
      local_980._24_8_ = auVar100._24_8_;
      uVar60 = local_980._24_8_;
      local_484 = 5;
      auVar100 = vpsrld_avx2(auVar100,ZEXT416(5));
      local_980._0_8_ = auVar100._0_8_;
      local_80 = local_980._0_8_;
      local_980._8_8_ = auVar100._8_8_;
      uStack_78 = local_980._8_8_;
      local_980._16_8_ = auVar100._16_8_;
      uStack_70 = local_980._16_8_;
      local_980._24_8_ = auVar100._24_8_;
      uStack_68 = local_980._24_8_;
      uVar35 = local_980._16_8_;
      uVar36 = local_980._24_8_;
      local_a0 = local_980._16_8_;
      uStack_98 = local_980._24_8_;
      uStack_90 = 0;
      uStack_88 = 0;
      auVar26 = vpackusdw_avx2(auVar100,ZEXT1632(auVar100._16_16_));
      if (0x17 - iVar83 < 9) {
        local_960._16_8_ = auStack_710._0_8_;
        local_960._0_16_ = auVar20;
        local_960._24_8_ = auStack_710._8_8_;
      }
      else {
        local_608 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)iVar83 * 2);
        local_5d0 = *(undefined8 *)*local_608;
        uStack_5c8 = *(undefined8 *)(*local_608 + 8);
        local_7e0 = vpmovzxwd_avx2(*local_608);
        local_610 = (undefined1 (*) [16])(in_RDX + 0x12 + (long)iVar83 * 2);
        local_5e0 = *(undefined8 *)*local_610;
        uStack_5d8 = *(undefined8 *)(*local_610 + 8);
        local_820 = vpmovzxwd_avx2(*local_610);
        local_380 = local_820._0_8_;
        uStack_378 = local_820._8_8_;
        uStack_370 = local_820._16_8_;
        uStack_368 = local_820._24_8_;
        local_3a0 = local_7e0._0_8_;
        uStack_398 = local_7e0._8_8_;
        uStack_390 = local_7e0._16_8_;
        uStack_388 = local_7e0._24_8_;
        local_8a0 = vpsubd_avx2(local_820,local_7e0);
        local_400 = local_7e0._0_8_;
        uStack_3f8 = local_7e0._8_8_;
        uStack_3f0 = local_7e0._16_8_;
        uStack_3e8 = local_7e0._24_8_;
        local_404 = 5;
        auVar100 = vpslld_avx2(local_7e0,ZEXT416(5));
        local_840._0_8_ = auVar100._0_8_;
        local_840._8_8_ = auVar100._8_8_;
        local_840._16_8_ = auVar100._16_8_;
        local_840._24_8_ = auVar100._24_8_;
        local_2c0 = local_840._0_8_;
        uStack_2b8 = local_840._8_8_;
        uStack_2b0 = local_840._16_8_;
        uStack_2a8 = local_840._24_8_;
        local_2e0 = local_5a0._0_8_;
        uStack_2d8 = local_5a0._8_8_;
        uStack_2d0 = auStack_590._0_8_;
        uStack_2c8 = auStack_590._8_8_;
        auVar28._16_8_ = auStack_590._0_8_;
        auVar28._0_16_ = auVar18;
        auVar28._24_8_ = auStack_590._8_8_;
        local_840 = vpaddd_avx2(auVar100,auVar28);
        local_200 = local_8a0._0_8_;
        uStack_1f8 = local_8a0._8_8_;
        uStack_1f0 = local_8a0._16_8_;
        uStack_1e8 = local_8a0._24_8_;
        local_220 = local_9e0._0_8_;
        uStack_218 = local_9e0._8_8_;
        uStack_210 = local_9e0._16_8_;
        uStack_208 = local_9e0._24_8_;
        local_940 = vpmulld_avx2(local_8a0,auVar25);
        local_300 = local_840._0_8_;
        uStack_2f8 = local_840._8_8_;
        uStack_2f0 = local_840._16_8_;
        uStack_2e8 = local_840._24_8_;
        local_320 = local_940._0_8_;
        uStack_318 = local_940._8_8_;
        uStack_310 = local_940._16_8_;
        uStack_308 = local_940._24_8_;
        auVar100 = vpaddd_avx2(local_840,local_940);
        local_960._0_8_ = auVar100._0_8_;
        local_960._8_8_ = auVar100._8_8_;
        local_960._16_8_ = auVar100._16_8_;
        local_960._24_8_ = auVar100._24_8_;
        local_4c0 = local_960._0_8_;
        uStack_4b8 = local_960._8_8_;
        uStack_4b0 = local_960._16_8_;
        uStack_4a8 = local_960._24_8_;
        local_4c4 = 5;
        auVar100 = vpsrld_avx2(auVar100,ZEXT416(5));
        local_960._0_8_ = auVar100._0_8_;
        local_960._8_8_ = auVar100._8_8_;
        local_960._16_8_ = auVar100._16_8_;
        local_960._24_8_ = auVar100._24_8_;
        local_740 = local_960._16_8_;
        uStack_738 = local_960._24_8_;
        local_c0 = local_960._0_8_;
        uStack_b8 = local_960._8_8_;
        uStack_b0 = local_960._16_8_;
        uStack_a8 = local_960._24_8_;
        local_e0 = local_960._16_8_;
        uStack_d8 = local_960._24_8_;
        uStack_d0 = 0;
        uStack_c8 = 0;
        local_960 = vpackusdw_avx2(auVar100,ZEXT1632(auVar100._16_16_));
      }
      auVar100._0_16_ = ZEXT116(0) * local_960._0_16_ + ZEXT116(1) * auVar26._0_16_;
      auVar100._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * local_960._0_16_;
      local_182 = (ushort)iVar83;
      local_184 = local_182 + 1;
      local_186 = local_182 + 2;
      local_188 = local_182 + 3;
      local_18a = local_182 + 4;
      local_18c = local_182 + 5;
      local_18e = local_182 + 6;
      local_190 = local_182 + 7;
      local_192 = local_182 + 8;
      local_194 = local_182 + 9;
      local_196 = local_182 + 10;
      local_198 = local_182 + 0xb;
      local_19a = local_182 + 0xc;
      local_19c = local_182 + 0xd;
      local_19e = local_182 + 0xe;
      local_1a0 = local_182 + 0xf;
      auVar14 = vpinsrw_avx(ZEXT216(local_182),(uint)local_184,1);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_186,2);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_188,3);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_18a,4);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_18c,5);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_18e,6);
      local_180 = vpinsrw_avx(auVar14,(uint)local_190,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_192),(uint)local_194,1);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_196,2);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_198,3);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_19a,4);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_19c,5);
      auVar14 = vpinsrw_avx(auVar14,(uint)local_19e,6);
      auStack_170 = vpinsrw_avx(auVar14,(uint)local_1a0,7);
      auVar78._16_8_ = local_6e0._16_8_;
      auVar78._0_16_ = auVar99._0_16_;
      auVar78._24_8_ = local_6e0._24_8_;
      auVar29._16_8_ = auStack_170._0_8_;
      auVar29._0_16_ = local_180;
      auVar29._24_8_ = auStack_170._8_8_;
      auVar28 = vpcmpgtw_avx2(auVar78,auVar29);
      local_100 = local_720._0_8_;
      uStack_f8 = local_720._8_8_;
      uStack_f0 = auStack_710._0_8_;
      uStack_e8 = auStack_710._8_8_;
      local_9a0._16_8_ = auVar100._16_8_;
      uStack_110 = local_9a0._16_8_;
      local_9a0._24_8_ = auVar100._24_8_;
      uStack_108 = local_9a0._24_8_;
      local_900._0_8_ = auVar28._0_8_;
      local_140 = local_900._0_8_;
      local_900._8_8_ = auVar28._8_8_;
      uStack_138 = local_900._8_8_;
      local_900._16_8_ = auVar28._16_8_;
      uStack_130 = local_900._16_8_;
      local_900._24_8_ = auVar28._24_8_;
      uStack_128 = local_900._24_8_;
      auVar80._16_8_ = auStack_710._0_8_;
      auVar80._0_16_ = auVar20;
      auVar80._24_8_ = auStack_710._8_8_;
      auVar79._16_8_ = local_9a0._16_8_;
      auVar79._0_16_ = auVar100._0_16_;
      auVar79._24_8_ = local_9a0._24_8_;
      auVar27 = vpblendvb_avx2(auVar80,auVar79,auVar28);
      *(undefined1 (*) [32])(local_1220 + (long)local_908 * 4) = auVar27;
      local_904 = in_R8D + local_904;
      local_9e4 = 0x17 - iVar83;
      local_9e0 = auVar25;
      local_9a0 = auVar100;
      local_980 = auVar26;
      local_900 = auVar28;
      local_8e0 = local_180._0_8_;
      uStack_8d8 = local_180._8_8_;
      uStack_8d0 = auStack_170._0_8_;
      uStack_8c8 = auStack_170._8_8_;
      local_800 = auVar24;
      local_7c0 = auVar23;
      local_760 = local_960._0_8_;
      uStack_758 = local_960._8_8_;
      uStack_750 = local_960._16_8_;
      uStack_748 = local_960._24_8_;
      local_730 = uVar35;
      uStack_728 = uVar36;
      local_6a0 = local_180._0_8_;
      uStack_698 = local_180._8_8_;
      uStack_690 = auStack_170._0_8_;
      uStack_688 = auStack_170._8_8_;
      uStack_670 = local_6e0._16_8_;
      uStack_668 = local_6e0._24_8_;
      local_660 = local_520._0_8_;
      uStack_658 = local_520._8_8_;
      uStack_650 = auStack_510._0_8_;
      uStack_648 = auStack_510._8_8_;
      local_640 = local_560._0_8_;
      uStack_638 = local_560._8_8_;
      uStack_630 = auStack_550._0_8_;
      uStack_628 = auStack_550._8_8_;
      local_600 = pauVar5;
      local_5f8 = pauVar2;
      local_5e8 = uVar8;
      local_5c0 = uVar33;
      uStack_5b8 = uVar34;
      local_5b0 = uVar31;
      uStack_5a8 = uVar32;
      local_560 = auVar10;
      auStack_550 = auVar11;
      local_540 = uVar8;
      local_53c = uVar8;
      local_538 = uVar8;
      local_534 = uVar8;
      local_530 = uVar8;
      local_52c = uVar8;
      local_528 = uVar8;
      local_524 = uVar8;
      local_520 = auVar12;
      auStack_510 = auVar13;
      local_4e4 = uVar9;
      local_4e0 = uVar9;
      local_4dc = uVar9;
      local_4d8 = uVar9;
      local_4d4 = uVar9;
      local_4d0 = uVar9;
      local_4cc = uVar9;
      local_4c8 = uVar9;
      local_480 = uVar57;
      uStack_478 = uVar58;
      uStack_470 = uVar59;
      uStack_468 = uVar60;
      local_440 = auVar22;
      local_3c0 = uVar41;
      uStack_3b8 = uVar42;
      uStack_3b0 = uVar43;
      uStack_3a8 = uVar44;
      local_360 = uVar41;
      uStack_358 = uVar42;
      uStack_350 = uVar43;
      uStack_348 = uVar44;
      local_340 = uVar37;
      uStack_338 = uVar38;
      uStack_330 = uVar39;
      uStack_328 = uVar40;
      local_2a0 = uVar53;
      uStack_298 = uVar54;
      uStack_290 = uVar55;
      uStack_288 = uVar56;
      local_280 = uVar49;
      uStack_278 = uVar50;
      uStack_270 = uVar51;
      uStack_268 = uVar52;
      local_260 = local_5a0._0_8_;
      uStack_258 = local_5a0._8_8_;
      uStack_250 = auStack_590._0_8_;
      uStack_248 = auStack_590._8_8_;
      local_240 = uVar45;
      uStack_238 = uVar46;
      uStack_230 = uVar47;
      uStack_228 = uVar48;
      local_160 = local_182;
      local_15e = local_184;
      local_15c = local_186;
      local_15a = local_188;
      local_158 = local_18a;
      local_156 = local_18c;
      local_154 = local_18e;
      local_152 = local_190;
      local_150 = local_192;
      local_14e = local_194;
      local_14c = local_196;
      local_14a = local_198;
      local_148 = local_19a;
      local_146 = local_19c;
      local_144 = local_19e;
      local_142 = local_1a0;
      auVar10 = auVar99._0_16_;
    }
  }
  auStack_590 = auVar19;
  local_5a0 = auVar18;
  local_6e0 = auVar22;
  auStack_710 = auVar21;
  local_720 = auVar20;
  local_d00 = auVar26;
  auStack_d30 = auVar16;
  local_d40 = auVar15;
  auStack_d70 = auVar14;
  local_d80 = auVar13;
  auStack_db0 = auVar12;
  local_dc0 = auVar11;
  local_10f0 = in_RSI;
  local_10e8 = in_RDI;
  local_f40 = auVar98._0_16_;
  auStack_f30 = auVar98._16_16_;
  local_8c0 = auVar99._0_16_;
  auStack_8b0 = auVar99._16_16_;
  local_c00 = auVar17;
  local_680 = auVar10;
  local_120 = auVar100._0_16_;
  highbd_transpose8x16_16x8_avx2(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
  for (local_1324 = 0; local_1324 < 8; local_1324 = local_1324 + 1) {
    lVar97 = (long)local_1324;
    puVar3 = (undefined8 *)(local_10e8 + lVar97 * local_10f0 * 2);
    uVar31 = local_1320[lVar97 * 4 + 1];
    *puVar3 = local_1320[lVar97 * 4];
    puVar3[1] = uVar31;
  }
  for (local_1328 = 8; local_1328 < 0x10; local_1328 = local_1328 + 1) {
    puVar3 = (undefined8 *)(local_10e8 + local_1328 * local_10f0 * 2);
    uVar31 = local_1320[(long)(local_1328 + -8) * 4 + 3];
    *puVar3 = local_1320[(long)(local_1328 + -8) * 4 + 2];
    puVar3[1] = uVar31;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_8x16_avx2(uint16_t *dst, ptrdiff_t stride,
                                              const uint16_t *left,
                                              int upsample_left, int dy,
                                              int bd) {
  __m256i dstvec[8], d[8];
  if (bd < 12) {
    highbd_dr_prediction_z1_16xN_internal_avx2(8, dstvec, left, upsample_left,
                                               dy);
  } else {
    highbd_dr_prediction_32bit_z1_16xN_internal_avx2(8, dstvec, left,
                                                     upsample_left, dy);
  }
  highbd_transpose8x16_16x8_avx2(dstvec, d);
  for (int i = 0; i < 8; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride),
                     _mm256_castsi256_si128(d[i]));
  }
  for (int i = 8; i < 16; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride),
                     _mm256_extracti128_si256(d[i - 8], 1));
  }
}